

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkmsdevice.cpp
# Opt level: O3

void __thiscall QKmsScreenConfig::QKmsScreenConfig(QKmsScreenConfig *this)

{
  this->_vptr_QKmsScreenConfig = (_func_int **)&PTR__QKmsScreenConfig_00155e20;
  (this->m_devicePath).d.d = (Data *)0x0;
  (this->m_devicePath).d.ptr = (char16_t *)0x0;
  *(undefined8 *)((long)&(this->m_devicePath).d.ptr + 1) = 0;
  *(undefined8 *)((long)&(this->m_devicePath).d.size + 1) = 0;
  (this->m_headlessSize).wd = -1;
  (this->m_headlessSize).ht = -1;
  this->m_hwCursor = true;
  this->m_separateScreens = false;
  this->m_pbuffers = false;
  this->m_virtualDesktopLayout = VirtualDesktopLayoutHorizontal;
  (this->m_outputSettings).d.d.ptr =
       (QMapData<std::map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>_>
        *)0x0;
  return;
}

Assistant:

QKmsScreenConfig::QKmsScreenConfig()
    : m_headless(false)
    , m_hwCursor(true)
    , m_separateScreens(false)
    , m_pbuffers(false)
    , m_virtualDesktopLayout(VirtualDesktopLayoutHorizontal)
{
}